

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

void Z80::OpCode_RST(void)

{
  byte bVar1;
  char cVar2;
  undefined8 in_RSI;
  
  do {
    bVar1 = GetByteNoMem((char **)0x0,SUB81(in_RSI,0));
    if ((bVar1 & 199) != 0) {
      Error("[RST] Illegal operand",::line,PASS3);
      SkipToEol(&lp);
      return;
    }
    in_RSI = 1;
    EmitByte(bVar1 | 199,true);
    cVar2 = (*DAT_0018e520)();
  } while (cVar2 != '\0');
  return;
}

Assistant:

static void OpCode_RST() {
		do {
			byte e = GetByteNoMem(lp);
			if (e&(~0x38)) {	// some bit is set which should be not
				Error("[RST] Illegal operand", line); SkipToEol(lp);
				return;
			} else {			// e == { $00, $08, $10, $18, $20, $28, $30, $38 }
				EmitByte(0xC7 + e, true);
			}
		} while (Options::syx.MultiArg(lp));
	}